

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_test.cxx
# Opt level: O1

int raft_server_test::add_node_error_cases_test(void)

{
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *pcVar1;
  _func_int **pp_Var2;
  element_type eVar3;
  undefined8 this;
  code cVar4;
  int iVar5;
  cmd_result_code cVar6;
  ostream *poVar7;
  int __how;
  int __how_00;
  int __how_01;
  long lVar8;
  element_type *peVar9;
  int __fd;
  string *psVar10;
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *configs_out;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  _func_int *p_Var12;
  initializer_list<RaftPkg_*> __l;
  atomic<bool> invoked;
  rpc_handler nl_handler;
  ptr<req_msg> req;
  ptr<log_entry> log;
  ptr<log_entry> log_1;
  ptr<FakeNetwork> c_net;
  rpc_handler bad_req_handler;
  ptr<FakeNetworkBase> f_base;
  ptr<log_entry> log_2;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> pkgs;
  string s1_addr;
  string s2_addr;
  string s3_addr;
  RaftPkg s1;
  RaftPkg s3;
  RaftPkg s2;
  undefined1 local_59a [2];
  undefined1 local_598 [24];
  code *pcStack_580;
  undefined1 local_578 [32];
  undefined1 local_558 [24];
  undefined1 local_540 [8];
  undefined1 local_538 [16];
  undefined1 local_528 [8];
  undefined1 local_520 [8];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [8];
  undefined1 local_4f0 [8];
  undefined1 local_4e8 [16];
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> local_4d8;
  __atomic_base<unsigned_long> local_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b8;
  atomic<unsigned_long> local_4b0;
  string local_4a8;
  string local_488;
  string local_468;
  undefined1 local_448 [32];
  undefined1 local_428 [16];
  undefined1 local_418 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  undefined1 local_408 [328];
  RaftPkg local_2c0;
  RaftPkg local_178;
  
  raft_functional_common::reset_log_files();
  local_4f8 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::FakeNetworkBase,std::allocator<nuraft::FakeNetworkBase>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4f0,(FakeNetworkBase **)local_4f8,
             (allocator<nuraft::FakeNetworkBase> *)local_408);
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"S1","");
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"S2","");
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"S3","");
  RaftPkg::RaftPkg((RaftPkg *)local_408,(ptr<FakeNetworkBase> *)local_4f8,1,&local_4a8);
  RaftPkg::RaftPkg(&local_178,(ptr<FakeNetworkBase> *)local_4f8,2,&local_488);
  RaftPkg::RaftPkg(&local_2c0,(ptr<FakeNetworkBase> *)local_4f8,3,&local_468);
  __l._M_len = 3;
  __l._M_array = (iterator)local_518;
  local_518._0_8_ = (RaftPkg *)local_408;
  local_518._8_8_ = &local_178;
  local_508._0_8_ = &local_2c0;
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::vector
            (&local_4d8,__l,(allocator_type *)local_598);
  iVar5 = launch_servers(&local_4d8,(raft_params *)0x0,false);
  if (iVar5 != 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_518._0_8_,local_518._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
    pp_Var2 = poVar7->_vptr_basic_ostream;
    *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
         *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
    p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
    if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
      cVar4 = (code)std::ios::widen((char)p_Var12);
      p_Var12[0xe0] = cVar4;
      p_Var12[0xe1] = (code)0x1;
    }
    p_Var12[0xe0] = (code)0x30;
    local_598._0_8_ = pthread_self();
    std::_Hash_bytes(local_598,8,0xc70f6907);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"add_node_error_cases_test",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x11a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"    value of: \x1b[1;34mlaunch_servers( pkgs )\x1b[0m\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
    if ((RaftPkg *)local_518._0_8_ != (RaftPkg *)local_508) {
      operator_delete((void *)local_518._0_8_);
    }
    iVar5 = -1;
    TestSuite::failHandler();
    goto LAB_001118c6;
  }
  local_4c0._M_i =
       (long)local_4d8.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_4d8.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  if ((int)local_4c0._M_i < 1) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_518._0_8_,local_518._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
    pp_Var2 = poVar7->_vptr_basic_ostream;
    *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
         *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
    p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
    if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
      cVar4 = (code)std::ios::widen((char)p_Var12);
      p_Var12[0xe0] = cVar4;
      p_Var12[0xe1] = (code)0x1;
    }
    p_Var12[0xe0] = (code)0x30;
    local_598._0_8_ = pthread_self();
    std::_Hash_bytes(local_598,8,0xc70f6907);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"add_node_error_cases_test",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x11d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"\x1b[1;34mnum_srvs > 0\x1b[0m\n",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    value of ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;32mnum_srvs\x1b[0m: ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;31m",7);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)local_4c0._M_i);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    value of ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;32m0\x1b[0m: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;31m",7);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
    if ((RaftPkg *)local_518._0_8_ != (RaftPkg *)local_508) {
      operator_delete((void *)local_518._0_8_);
    }
    iVar5 = -1;
    TestSuite::failHandler();
    goto LAB_001118c6;
  }
  local_528 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::FakeNetwork,std::allocator<nuraft::FakeNetwork>,char_const(&)[7],std::shared_ptr<nuraft::FakeNetworkBase>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_520,(FakeNetwork **)local_528,
             (allocator<nuraft::FakeNetwork> *)local_518,(char (*) [7])0x1b0f9b,
             (shared_ptr<nuraft::FakeNetworkBase> *)local_4f8);
  std::__shared_ptr<nuraft::FakeNetwork,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nuraft::FakeNetwork,nuraft::FakeNetwork>
            ((__shared_ptr<nuraft::FakeNetwork,(__gnu_cxx::_Lock_policy)2> *)local_528,
             (FakeNetwork *)local_528);
  nuraft::FakeNetworkBase::addNetwork((FakeNetworkBase *)local_4f8,(ptr<FakeNetwork> *)local_528);
  (**(code **)(*(long *)local_528 + 0x10))(local_418,local_528,&local_4a8);
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410._M_pi);
  }
  (**(code **)(*(long *)local_528 + 0x10))(local_428,local_528,&local_488);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
  }
  local_518._0_8_ = local_59a;
  local_59a[0] = 0;
  local_518._8_8_ = 0;
  local_508._8_8_ =
       std::
       _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx:293:35)>
       ::_M_invoke;
  local_508._0_8_ =
       std::
       _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx:293:35)>
       ::_M_manager;
  local_578._0_8_ = 0;
  local_578._8_8_ = operator_new(0x60);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_)->_M_weak_count = 1;
  local_4b0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)&PTR___Sp_counted_ptr_inplace_001d1b00;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001d1b00;
  local_578._0_8_ = local_578._8_8_ + 0x10;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x10))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x10))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x20))->_vptr__Sp_counted_base
       = (_func_int **)0x6;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x20))->_M_use_count = 0;
  local_4b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__req_msg_001d1b50;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x10))->_vptr__Sp_counted_base
       = (_func_int **)&PTR__req_msg_001d1b50;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x30))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x30))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x30))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x40))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x40))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x40))->_M_weak_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x50))->_vptr__Sp_counted_base
       = (_func_int **)0x0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x50))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x50))->_M_weak_count = 0;
  if (1 < local_4c0._M_i) {
    peVar9 = (element_type *)0x1;
    do {
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((*(pointer)((long)local_4d8.
                                   super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl
                                   .super__Vector_impl_data._M_start + (long)peVar9 * 8))->sMgr).
                super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[9].
                _vptr_state_mgr;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      nuraft::srv_config::serialize((srv_config *)local_598);
      local_540 = (undefined1  [8])((ulong)local_540 & 0xffffffff00000000);
      local_59a[1] = 3;
      local_558._0_8_ =
           (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_558 + 8),
                 (log_entry **)local_558,(allocator<nuraft::log_entry> *)local_4e8,(int *)local_540,
                 (shared_ptr<nuraft::buffer> *)local_598,local_59a + 1);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   *)(local_578._0_8_ + 0x38),(value_type *)local_558);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_);
      }
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
      }
      peVar9 = (element_type *)
               ((long)&(peVar9->super_delayed_task_scheduler)._vptr_delayed_task_scheduler + 1);
    } while ((element_type *)local_4c0._M_i != peVar9);
  }
  nuraft::FakeNetwork::findClient((FakeNetwork *)local_598,(string *)local_528);
  (**(code **)(*(_func_int **)local_598._0_8_ + 0x10))(local_598._0_8_,local_578,local_518,0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_);
  }
  pcVar1 = (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
           (local_598 + 0x10);
  local_598._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_598._16_8_ = local_598._16_8_ & 0xffffffffffffff00;
  local_598._0_8_ = pcVar1;
  nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_528,(string *)local_598);
  if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
      local_598._0_8_ != pcVar1) {
    operator_delete((void *)local_598._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_);
  }
  if ((local_59a[0] & 1) == 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_598._0_8_,local_598._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
    pp_Var2 = poVar7->_vptr_basic_ostream;
    *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
         *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
    p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
    if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
      cVar4 = (code)std::ios::widen((char)p_Var12);
      p_Var12[0xe0] = cVar4;
      p_Var12[0xe1] = (code)0x1;
    }
    p_Var12[0xe0] = (code)0x30;
    local_578._0_8_ = pthread_self();
    std::_Hash_bytes(local_578,8,0xc70f6907);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"add_node_error_cases_test",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
               ,0x6a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x13b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"    value of: \x1b[1;34minvoked.load()\x1b[0m\n",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
LAB_0011285c:
    if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
        local_598._0_8_ != pcVar1) {
      operator_delete((void *)local_598._0_8_);
    }
    iVar5 = -1;
    TestSuite::failHandler();
  }
  else {
    LOCK();
    local_59a[0] = 0;
    UNLOCK();
    local_578._0_8_ = 0;
    local_578._8_8_ = operator_new(0x60);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_)->_vptr__Sp_counted_base =
         (_func_int **)local_4b0.super___atomic_base<unsigned_long>._M_i;
    local_578._0_8_ = local_578._8_8_ + 0x10;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x10))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x10))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x20))->
    _vptr__Sp_counted_base = (_func_int **)0x6;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x20))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x10))->
    _vptr__Sp_counted_base = (_func_int **)local_4b8._M_pi;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x30))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x30))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x30))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x40))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x40))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x40))->_M_weak_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x50))->
    _vptr__Sp_counted_base = (_func_int **)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x50))->_M_use_count = 0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_578._8_8_ + 0x50))->_M_weak_count = 0;
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((*(RaftPkg **)
                 ((long)local_4d8.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
                        super__Vector_impl_data._M_start + 8))->sMgr).
              super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[9].
              _vptr_state_mgr;
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      }
    }
    nuraft::srv_config::serialize((srv_config *)local_558);
    local_598._0_8_ = local_598._0_8_ & 0xffffffff00000000;
    local_59a[1] = 2;
    local_540 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_538,(log_entry **)local_540,
               (allocator<nuraft::log_entry> *)local_4e8,(int *)local_598,
               (shared_ptr<nuraft::buffer> *)local_558,local_59a + 1);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)(local_578._0_8_ + 0x38),(value_type *)local_540);
    nuraft::FakeNetwork::findClient((FakeNetwork *)local_598,(string *)local_528);
    (**(code **)(*(_func_int **)local_598._0_8_ + 0x10))(local_598._0_8_,local_578,local_518,0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_);
    }
    local_598._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_598._16_8_ = local_598._16_8_ & 0xffffffffffffff00;
    local_598._0_8_ = pcVar1;
    nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_528,(string *)local_598);
    if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
        local_598._0_8_ != pcVar1) {
      operator_delete((void *)local_598._0_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._0_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
    }
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_);
    }
    if ((local_59a[0] & 1) == 0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_598._0_8_,local_598._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
      pp_Var2 = poVar7->_vptr_basic_ostream;
      *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
      p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
      if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
        cVar4 = (code)std::ios::widen((char)p_Var12);
        p_Var12[0xe0] = cVar4;
        p_Var12[0xe1] = (code)0x1;
      }
      p_Var12[0xe0] = (code)0x30;
      local_578._0_8_ = pthread_self();
      std::_Hash_bytes(local_578,8,0xc70f6907);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"add_node_error_cases_test",0x19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x14b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"    value of: \x1b[1;34minvoked.load()\x1b[0m\n",0x28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
      goto LAB_0011285c;
    }
    LOCK();
    local_59a[0] = 0;
    UNLOCK();
    eVar3._vptr_state_mgr =
         *(_func_int ***)
          ((long)local_178.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 0x48);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar3._vptr_state_mgr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(eVar3._vptr_state_mgr + 1) = *(int *)(eVar3._vptr_state_mgr + 1) + 1;
        UNLOCK();
      }
      else {
        *(int *)(eVar3._vptr_state_mgr + 1) = *(int *)(eVar3._vptr_state_mgr + 1) + 1;
      }
    }
    nuraft::raft_server::add_srv((raft_server *)(local_448 + 0x10),(srv_config *)local_408._312_8_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._24_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar3._vptr_state_mgr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar3._vptr_state_mgr);
    }
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              ((element_type *)
              ((long)local_2c0.sMgr.
                     super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x48
              ))->_vptr_state_machine;
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      }
    }
    nuraft::raft_server::add_srv((raft_server *)local_558,(srv_config *)local_408._312_8_);
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    }
    cVar6 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
            get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                             *)local_558._0_8_);
    if (cVar6 == SERVER_IS_JOINING) {
      local_598._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_598._16_8_ = local_598._16_8_ & 0xffffffffffffff00;
      local_598._0_8_ = pcVar1;
      nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_408._56_8_,(string *)local_598);
      if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
          local_598._0_8_ != pcVar1) {
        operator_delete((void *)local_598._0_8_);
      }
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((element_type *)
                ((long)local_2c0.sMgr.
                       super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                0x48))->_vptr_state_machine;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      nuraft::raft_server::add_srv((raft_server *)local_598,(srv_config *)local_408._312_8_);
      this = local_558._8_8_;
      local_558._8_8_ = local_598._8_8_;
      local_558._0_8_ = local_598._0_8_;
      local_598._0_8_ =
           (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)0x0;
      local_598._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_);
      }
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
      }
      cVar6 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
              ::get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                                 *)local_558._0_8_);
      if (cVar6 == OK) {
        lVar8 = 3;
      }
      else {
        cVar6 = nuraft::
                cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::
                get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                                 *)local_558._0_8_);
        lVar8 = 2;
        if (cVar6 != CONFIG_CHANGING) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
          std::ostream::put(-0x68);
          poVar7 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_598._0_8_,local_598._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
          pp_Var2 = poVar7->_vptr_basic_ostream;
          *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
               *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
          *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
          p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
          if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
            cVar4 = (code)std::ios::widen((char)p_Var12);
            p_Var12[0xe0] = cVar4;
            p_Var12[0xe1] = (code)0x1;
          }
          p_Var12[0xe0] = (code)0x30;
          local_578._0_8_ = pthread_self();
          std::_Hash_bytes(local_578,8,0xc70f6907);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
               *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 |
               2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"add_node_error_cases_test",0x19);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                     ,0x6a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x167);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n",0x30);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15)
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,-6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15)
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,cVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
              local_598._0_8_ != pcVar1) {
            operator_delete((void *)local_598._0_8_);
          }
          TestSuite::failHandler();
          p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_;
          goto LAB_00113b14;
        }
      }
      local_598._8_8_ = (pointer)0x0;
      local_598._16_8_ = local_598._16_8_ & 0xffffffffffffff00;
      local_598._0_8_ = pcVar1;
      nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_408._56_8_,(string *)local_598);
      if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
          local_598._0_8_ != pcVar1) {
        operator_delete((void *)local_598._0_8_);
      }
      psVar10 = (string *)local_598;
      local_598._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_598._16_8_ = local_598._16_8_ & 0xffffffffffffff00;
      local_598._0_8_ = pcVar1;
      nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_408._56_8_,psVar10);
      if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
          local_598._0_8_ != pcVar1) {
        operator_delete((void *)local_598._0_8_);
      }
      iVar5 = wait_for_sm_exec(&local_4d8,(size_t)psVar10);
      if (iVar5 != 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        poVar7 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_598._0_8_,local_598._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
        pp_Var2 = poVar7->_vptr_basic_ostream;
        *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
        p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
        if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
          cVar4 = (code)std::ios::widen((char)p_Var12);
          p_Var12[0xe0] = cVar4;
          p_Var12[0xe1] = (code)0x1;
        }
        p_Var12[0xe0] = (code)0x30;
        local_578._0_8_ = pthread_self();
        std::_Hash_bytes(local_578,8,0xc70f6907);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"add_node_error_cases_test",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x16d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n",
                   0x44);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
            local_598._0_8_ != pcVar1) {
          operator_delete((void *)local_598._0_8_);
        }
        TestSuite::failHandler();
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_;
        goto LAB_00113b14;
      }
      nuraft::FakeTimer::invoke((FakeTimer *)local_408._72_8_,2);
      local_598._8_8_ = (pointer)0x0;
      local_598._16_8_ = local_598._16_8_ & 0xffffffffffffff00;
      local_598._0_8_ = pcVar1;
      nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_408._56_8_,(string *)local_598);
      if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
          local_598._0_8_ != pcVar1) {
        operator_delete((void *)local_598._0_8_);
      }
      psVar10 = (string *)local_598;
      local_598._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_598._16_8_ = local_598._16_8_ & 0xffffffffffffff00;
      local_598._0_8_ = pcVar1;
      nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_408._56_8_,psVar10);
      if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
          local_598._0_8_ != pcVar1) {
        operator_delete((void *)local_598._0_8_);
      }
      iVar5 = wait_for_sm_exec(&local_4d8,(size_t)psVar10);
      if (iVar5 != 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
        std::ostream::put(-0x68);
        poVar7 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_598._0_8_,local_598._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
        pp_Var2 = poVar7->_vptr_basic_ostream;
        *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
        p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
        if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
          cVar4 = (code)std::ios::widen((char)p_Var12);
          p_Var12[0xe0] = cVar4;
          p_Var12[0xe1] = (code)0x1;
        }
        p_Var12[0xe0] = (code)0x30;
        local_578._0_8_ = pthread_self();
        std::_Hash_bytes(local_578,8,0xc70f6907);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"add_node_error_cases_test",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x173);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n",
                   0x44);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
            local_598._0_8_ != pcVar1) {
          operator_delete((void *)local_598._0_8_);
        }
        TestSuite::failHandler();
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_;
        goto LAB_00113b14;
      }
      local_578._0_8_ =
           (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)0x0;
      local_578._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_578._16_8_ = 0;
      nuraft::raft_server::get_srv_config_all
                ((raft_server *)local_408._312_8_,
                 (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  *)local_578);
      if (lVar8 != (long)(local_578._8_8_ - local_578._0_8_) >> 4) {
        poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_598._0_8_,local_598._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
        pp_Var2 = poVar7->_vptr_basic_ostream;
        *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
        p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
        if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
          cVar4 = (code)std::ios::widen((char)p_Var12);
          p_Var12[0xe0] = cVar4;
          p_Var12[0xe1] = (code)0x1;
        }
        p_Var12[0xe0] = (code)0x30;
        local_540 = (undefined1  [8])pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)local_4e8,(id *)local_540);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"add_node_error_cases_test",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x178);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"    value of: \x1b[1;34mconfigs_out.size()\x1b[0m\n",0x2c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
            local_598._0_8_ != pcVar1) {
          operator_delete((void *)local_598._0_8_);
        }
        TestSuite::failHandler();
        std::
        vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
        ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                   *)local_578);
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_;
        goto LAB_00113b14;
      }
      std::
      vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 *)local_578);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
      }
      eVar3._vptr_state_mgr =
           *(_func_int ***)
            ((long)local_178.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x48);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar3._vptr_state_mgr !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(eVar3._vptr_state_mgr + 1) = *(int *)(eVar3._vptr_state_mgr + 1) + 1;
          UNLOCK();
        }
        else {
          *(int *)(eVar3._vptr_state_mgr + 1) = *(int *)(eVar3._vptr_state_mgr + 1) + 1;
        }
      }
      nuraft::raft_server::add_srv((raft_server *)local_578,(srv_config *)local_408._312_8_);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar3._vptr_state_mgr !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar3._vptr_state_mgr);
      }
      cVar6 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
              ::get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                                 *)local_578._0_8_);
      if (cVar6 != SERVER_ALREADY_EXISTS) {
        poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_598._0_8_,local_598._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
        pp_Var2 = poVar7->_vptr_basic_ostream;
        *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
        p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
        if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
          cVar4 = (code)std::ios::widen((char)p_Var12);
          p_Var12[0xe0] = cVar4;
          p_Var12[0xe1] = (code)0x1;
        }
        p_Var12[0xe0] = (code)0x30;
        local_558._0_8_ = pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)local_540,(id *)local_558);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"add_node_error_cases_test",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x17e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n",0x30);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,-5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,cVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
            local_598._0_8_ != pcVar1) {
          operator_delete((void *)local_598._0_8_);
        }
        TestSuite::failHandler();
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_;
        goto LAB_00113b14;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_);
      }
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((element_type *)
                ((long)local_2c0.sMgr.
                       super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                0x48))->_vptr_state_machine;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      nuraft::raft_server::add_srv
                ((raft_server *)local_578,
                 (srv_config *)
                 local_178.raftServer.
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
      }
      cVar6 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
              ::get_result_code((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                                 *)local_578._0_8_);
      if (cVar6 != NOT_LEADER) {
        poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_598._0_8_,local_598._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
        pp_Var2 = poVar7->_vptr_basic_ostream;
        *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
        p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
        if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
          cVar4 = (code)std::ios::widen((char)p_Var12);
          p_Var12[0xe0] = cVar4;
          p_Var12[0xe1] = (code)0x1;
        }
        p_Var12[0xe0] = (code)0x30;
        local_558._0_8_ = pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)local_540,(id *)local_558);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"add_node_error_cases_test",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x184);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n",0x30);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,-3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,cVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
            local_598._0_8_ != pcVar1) {
          operator_delete((void *)local_598._0_8_);
        }
        TestSuite::failHandler();
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_;
        goto LAB_00113b14;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_);
      }
      local_598._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_598._0_8_ = local_59a;
      pcStack_580 = std::
                    _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx:391:30)>
                    ::_M_invoke;
      local_598._16_8_ =
           std::
           _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx:391:30)>
           ::_M_manager;
      local_558._0_8_ = 0;
      local_558._8_8_ = operator_new(0x60);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_)->_vptr__Sp_counted_base =
           (_func_int **)local_4b0.super___atomic_base<unsigned_long>._M_i;
      local_558._0_8_ = local_558._8_8_ + 0x10;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))->_M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x20))->
      _vptr__Sp_counted_base = (_func_int **)0x6;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x20))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)local_4b8._M_pi;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x30))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x30))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x30))->_M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x40))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x40))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x40))->_M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x50))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x50))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_558._8_8_ + 0x50))->_M_weak_count = 0;
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((element_type *)
                ((long)local_2c0.sMgr.
                       super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                0x48))->_vptr_state_machine;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      nuraft::srv_config::serialize((srv_config *)local_540);
      local_578._0_8_ = local_578._0_8_ & 0xffffffff00000000;
      local_538[0xf] = '\x03';
      local_4e8._0_8_ = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4e8 + 8),
                 (log_entry **)local_4e8,(allocator<nuraft::log_entry> *)(local_59a + 1),
                 (int *)local_578,(shared_ptr<nuraft::buffer> *)local_540,local_538 + 0xf);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   *)(local_558._0_8_ + 0x38),(value_type *)local_4e8);
      nuraft::FakeNetwork::findClient((FakeNetwork *)local_578,(string *)local_528);
      (**(code **)(*(long *)local_578._0_8_ + 0x10))(local_578._0_8_,local_558,local_598,0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_);
      }
      pcVar1 = (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
               (local_578 + 0x10);
      local_578._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_578._16_8_ = local_578._16_8_ & 0xffffffffffffff00;
      local_578._0_8_ = pcVar1;
      nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_528,(string *)local_578);
      if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
          local_578._0_8_ != pcVar1) {
        operator_delete((void *)local_578._0_8_);
      }
      if ((element_type *)local_4e8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e8._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._0_8_);
      }
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
      }
      if ((local_59a[0] & 1) == 0) {
        poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)local_578._0_8_,local_578._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
        pp_Var2 = poVar7->_vptr_basic_ostream;
        *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
        p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
        if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
          cVar4 = (code)std::ios::widen((char)p_Var12);
          p_Var12[0xe0] = cVar4;
          p_Var12[0xe1] = (code)0x1;
        }
        p_Var12[0xe0] = (code)0x30;
        local_558._0_8_ = pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)local_540,(id *)local_558);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"add_node_error_cases_test",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                   ,0x6a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x199);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"    value of: \x1b[1;34minvoked.load()\x1b[0m\n",0x28);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"true",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"false",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
        if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
            local_578._0_8_ != pcVar1) {
          operator_delete((void *)local_578._0_8_);
        }
        iVar5 = -1;
        TestSuite::failHandler();
      }
      else {
        LOCK();
        local_59a[0] = 0;
        UNLOCK();
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((element_type *)
                  ((long)local_2c0.sMgr.
                         super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                  0x48))->_vptr_state_machine;
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          }
        }
        nuraft::raft_server::add_srv((raft_server *)local_448,(srv_config *)local_408._312_8_);
        if ((_Head_base<0UL,_nuraft::context_*,_false>)local_448._8_8_ !=
            (_Head_base<0UL,_nuraft::context_*,_false>)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._8_8_);
        }
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
        }
        local_578._8_8_ = (pointer)0x0;
        local_578._16_8_ = local_578._16_8_ & 0xffffffffffffff00;
        local_578._0_8_ = pcVar1;
        nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_408._56_8_,(string *)local_578);
        if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
            local_578._0_8_ != pcVar1) {
          operator_delete((void *)local_578._0_8_);
        }
        psVar10 = (string *)local_578;
        local_578._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_578._16_8_ = local_578._16_8_ & 0xffffffffffffff00;
        local_578._0_8_ = pcVar1;
        nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_408._56_8_,psVar10);
        if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
            local_578._0_8_ != pcVar1) {
          operator_delete((void *)local_578._0_8_);
        }
        iVar5 = wait_for_sm_exec(&local_4d8,(size_t)psVar10);
        if (iVar5 == 0) {
          nuraft::FakeTimer::invoke((FakeTimer *)local_408._72_8_,2);
          local_578._8_8_ = (pointer)0x0;
          local_578._16_8_ = local_578._16_8_ & 0xffffffffffffff00;
          local_578._0_8_ = pcVar1;
          nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_408._56_8_,(string *)local_578);
          if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
              local_578._0_8_ != pcVar1) {
            operator_delete((void *)local_578._0_8_);
          }
          psVar10 = (string *)local_578;
          local_578._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_578._16_8_ = local_578._16_8_ & 0xffffffffffffff00;
          local_578._0_8_ = pcVar1;
          nuraft::FakeNetwork::execReqResp((FakeNetwork *)local_408._56_8_,psVar10);
          if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
              local_578._0_8_ != pcVar1) {
            operator_delete((void *)local_578._0_8_);
          }
          iVar5 = wait_for_sm_exec(&local_4d8,(size_t)psVar10);
          if (iVar5 == 0) {
            configs_out = (vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                           *)local_558;
            local_558._0_8_ =
                 (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                 0x0;
            local_558._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_558._16_8_ = (element_type *)0x0;
            nuraft::raft_server::get_srv_config_all((raft_server *)local_408._312_8_,configs_out);
            __fd = (int)configs_out;
            iVar5 = (int)((ulong)(local_558._8_8_ - local_558._0_8_) >> 4);
            if (iVar5 == 3) {
              std::
              vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                         *)local_558);
              print_stats(&local_4d8);
              nuraft::raft_server::shutdown((raft_server *)local_408._312_8_,__fd,__how);
              nuraft::raft_server::shutdown
                        (local_178.raftServer.
                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         __fd,__how_00);
              nuraft::raft_server::shutdown
                        (local_2c0.raftServer.
                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         __fd,__how_01);
              iVar5 = 0;
              nuraft::FakeNetworkBase::destroy((FakeNetworkBase *)local_4f8);
            }
            else {
              poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
              TestSuite::getTimeString_abi_cxx11_();
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar7,(char *)local_578._0_8_,local_578._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
              pp_Var2 = poVar7->_vptr_basic_ostream;
              *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
                   *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
              *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
              p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
              if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
                cVar4 = (code)std::ios::widen((char)p_Var12);
                p_Var12[0xe0] = cVar4;
                p_Var12[0xe1] = (code)0x1;
              }
              p_Var12[0xe0] = (code)0x30;
              local_540 = (undefined1  [8])pthread_self();
              std::hash<std::thread::id>::operator()
                        ((hash<std::thread::id> *)local_4e8,(id *)local_540);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
                   *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) &
                   0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"add_node_error_cases_test",0x19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                         ,0x6a);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1ac);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"    value of: \x1b[1;34mconfigs_out.size()\x1b[0m\n",0x2c);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"    expected: \x1b[1;32m",0x15);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7,"      actual: \x1b[1;31m",0x15);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
              if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                  local_578._0_8_ != pcVar1) {
                operator_delete((void *)local_578._0_8_);
              }
              TestSuite::failHandler();
              std::
              vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              ::~vector((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                         *)local_558);
              iVar5 = -1;
            }
          }
          else {
            poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
            TestSuite::getTimeString_abi_cxx11_();
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)local_578._0_8_,local_578._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
            pp_Var2 = poVar7->_vptr_basic_ostream;
            *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
                 *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
            *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
            p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
            if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
              cVar4 = (code)std::ios::widen((char)p_Var12);
              p_Var12[0xe0] = cVar4;
              p_Var12[0xe1] = (code)0x1;
            }
            p_Var12[0xe0] = (code)0x30;
            local_558._0_8_ = pthread_self();
            std::hash<std::thread::id>::operator()
                      ((hash<std::thread::id> *)local_540,(id *)local_558);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
                 *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5
                 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"add_node_error_cases_test",0x19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                       ,0x6a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1a6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,
                       "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n"
                       ,0x44);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"    expected: \x1b[1;32m",0x15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"      actual: \x1b[1;31m",0x15);
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
            if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                local_578._0_8_ != pcVar1) {
              operator_delete((void *)local_578._0_8_);
            }
            iVar5 = -1;
            TestSuite::failHandler();
          }
        }
        else {
          poVar7 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_578._0_8_,local_578._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
          pp_Var2 = poVar7->_vptr_basic_ostream;
          *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
               *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
          *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
          p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
          if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
            cVar4 = (code)std::ios::widen((char)p_Var12);
            p_Var12[0xe0] = cVar4;
            p_Var12[0xe1] = (code)0x1;
          }
          p_Var12[0xe0] = (code)0x30;
          local_558._0_8_ = pthread_self();
          std::hash<std::thread::id>::operator()((hash<std::thread::id> *)local_540,(id *)local_558)
          ;
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
               *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 |
               2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"add_node_error_cases_test",0x19);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                     ,0x6a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1a0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n",
                     0x44);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15)
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,-1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
          if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
              local_578._0_8_ != pcVar1) {
            operator_delete((void *)local_578._0_8_);
          }
          iVar5 = -1;
          TestSuite::failHandler();
        }
      }
      if ((element_type *)local_598._16_8_ != (element_type *)0x0) {
        (*(code *)local_598._16_8_)(local_598,local_598,3);
      }
    }
    else {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      poVar7 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_598._0_8_,local_598._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[33m",5);
      pp_Var2 = poVar7->_vptr_basic_ostream;
      *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)pp_Var2[-3]) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
      p_Var12 = (_func_int *)((long)&poVar7->_vptr_basic_ostream + (long)pp_Var2[-3]);
      if ((&poVar7->field_0xe1)[(long)pp_Var2[-3]] == '\0') {
        cVar4 = (code)std::ios::widen((char)p_Var12);
        p_Var12[0xe0] = cVar4;
        p_Var12[0xe1] = (code)0x1;
      }
      p_Var12[0xe0] = (code)0x30;
      local_578._0_8_ = pthread_self();
      std::_Hash_bytes(local_578,8,0xc70f6907);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"add_node_error_cases_test",0x19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                 ,0x6a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[1;35m",7);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x158);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"    value of: \x1b[1;34mret->get_result_code()\x1b[0m\n",0x30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    expected: \x1b[1;32m",0x15);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,-7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"      actual: \x1b[1;31m",0x15);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,cVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\x1b[0m\n",5);
      if ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
          local_598._0_8_ != pcVar1) {
        operator_delete((void *)local_598._0_8_);
      }
      TestSuite::failHandler();
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_;
LAB_00113b14:
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
      }
      iVar5 = -1;
    }
  }
  if ((RaftPkg *)local_508._0_8_ != (RaftPkg *)0x0) {
    (*(code *)local_508._0_8_)(local_518,local_518,3);
  }
  if (local_520 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_520);
  }
LAB_001118c6:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_4d8.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(local_4d8.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  RaftPkg::~RaftPkg(&local_2c0);
  RaftPkg::~RaftPkg(&local_178);
  RaftPkg::~RaftPkg((RaftPkg *)local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if (local_4f0 != (undefined1  [8])0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4f0);
  }
  return iVar5;
}

Assistant:

int add_node_error_cases_test() {
    reset_log_files();
    ptr<FakeNetworkBase> f_base = cs_new<FakeNetworkBase>();

    std::string s1_addr = "S1";
    std::string s2_addr = "S2";
    std::string s3_addr = "S3";

    RaftPkg s1(f_base, 1, s1_addr);
    RaftPkg s2(f_base, 2, s2_addr);
    RaftPkg s3(f_base, 3, s3_addr);
    std::vector<RaftPkg*> pkgs = {&s1, &s2, &s3};

    CHK_Z( launch_servers( pkgs ) );

    size_t num_srvs = pkgs.size();
    CHK_GT(num_srvs, 0);

    ptr<FakeNetwork> c_net = cs_new<FakeNetwork>("client", f_base);
    f_base->addNetwork(c_net);
    c_net->create_client(s1_addr);
    c_net->create_client(s2_addr);

    std::atomic<bool> invoked(false);
    rpc_handler bad_req_handler = [&invoked]( ptr<resp_msg>& resp,
                                              ptr<rpc_exception>& err ) -> int {
        invoked.store(true);
        CHK_EQ( cmd_result_code::BAD_REQUEST, resp->get_result_code() );
        return 0;
    };

    {   // Attempt to add more than one server at once.
        ptr<req_msg> req = cs_new<req_msg>
                           ( (ulong)0, msg_type::add_server_request, 0, 0,
                             (ulong)0, (ulong)0, (ulong)0 );
        for (size_t ii=1; ii<num_srvs; ++ii) {
            RaftPkg* ff = pkgs[ii];
            ptr<srv_config> srv = ff->getTestMgr()->get_srv_config();
            ptr<buffer> buf(srv->serialize());
            ptr<log_entry> log( cs_new<log_entry>
                                ( 0, buf, log_val_type::cluster_server ) );
            req->log_entries().push_back(log);
        }
        c_net->findClient(s1_addr)->send( req, bad_req_handler );
        c_net->execReqResp();
    }
    CHK_TRUE(invoked.load());
    invoked = false;

    {   // Attempt to add server with wrong message type.
        ptr<req_msg> req = cs_new<req_msg>
                           ( (ulong)0, msg_type::add_server_request, 0, 0,
                             (ulong)0, (ulong)0, (ulong)0 );
        RaftPkg* ff = pkgs[1];
        ptr<srv_config> srv = ff->getTestMgr()->get_srv_config();
        ptr<buffer> buf(srv->serialize());
        ptr<log_entry> log( cs_new<log_entry>
                            ( 0, buf, log_val_type::conf ) );
        req->log_entries().push_back(log);
        c_net->findClient(s1_addr)->send( req, bad_req_handler );
        c_net->execReqResp();
    }
    CHK_TRUE(invoked.load());
    invoked = false;

    {   // Attempt to add server while previous one is in progress.

        // Add S2 to S1.
        s1.raftServer->add_srv( *(s2.getTestMgr()->get_srv_config()) );

        // Now adding S2 is in progress, add S3 to S1.
        ptr<raft_result> ret =
            s1.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );

        // Should fail.
        CHK_EQ( cmd_result_code::SERVER_IS_JOINING, ret->get_result_code() );

        // Join req/resp.
        s1.fNet->execReqResp();

        // Now config change is in progress, add S3 to S1.
        ret = s1.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );

        // May fail (depends on commit thread wake-up timing).
        size_t expected_cluster_size = 2;
        if (ret->get_result_code() == cmd_result_code::OK) {
            // If succeed, S3 is also a member of group.
            expected_cluster_size = 3;
        } else {
            // If not, error code should be CONFIG_CHANGNING.
            CHK_EQ( cmd_result_code::CONFIG_CHANGING, ret->get_result_code() );
        }

        // Finish adding S2 task.
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        // Heartbeat.
        s1.fTimer->invoke( timer_task_type::heartbeat_timer );
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        std::vector< ptr< srv_config > > configs_out;
        s1.raftServer->get_srv_config_all(configs_out);

        CHK_EQ(expected_cluster_size, configs_out.size());
    }

    {   // Attempt to add S2 again.
        ptr<raft_result> ret =
            s1.raftServer->add_srv( *(s2.getTestMgr()->get_srv_config()) );
        CHK_EQ( cmd_result_code::SERVER_ALREADY_EXISTS, ret->get_result_code() );
    }

    {   // Attempt to add S3 to S2 (non-leader).
        ptr<raft_result> ret =
            s2.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );
        CHK_EQ( cmd_result_code::NOT_LEADER, ret->get_result_code() );
    }

    rpc_handler nl_handler = [&invoked]( ptr<resp_msg>& resp,
                                         ptr<rpc_exception>& err ) -> int {
        invoked.store(true);
        CHK_EQ( cmd_result_code::NOT_LEADER, resp->get_result_code() );
        return 0;
    };
    {   // Attempt to add S3 to S2 (non-leader), through RPC.
        ptr<req_msg> req = cs_new<req_msg>
                           ( (ulong)0, msg_type::add_server_request, 0, 0,
                             (ulong)0, (ulong)0, (ulong)0 );
        ptr<srv_config> srv = s3.getTestMgr()->get_srv_config();
        ptr<buffer> buf(srv->serialize());
        ptr<log_entry> log( cs_new<log_entry>
                            ( 0, buf, log_val_type::cluster_server ) );
        req->log_entries().push_back(log);
        c_net->findClient(s2_addr)->send( req, nl_handler );
        c_net->execReqResp();
    }
    CHK_TRUE(invoked.load());
    invoked = false;

    {   // Now, normally add S3 to S1.
        s1.raftServer->add_srv( *(s3.getTestMgr()->get_srv_config()) );
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        // Heartbeat.
        s1.fTimer->invoke( timer_task_type::heartbeat_timer );
        s1.fNet->execReqResp();
        s1.fNet->execReqResp();
        CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

        std::vector< ptr< srv_config > > configs_out;
        s1.raftServer->get_srv_config_all(configs_out);

        // All 3 servers should exist.
        CHK_EQ(3, configs_out.size());
    }

    print_stats(pkgs);

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();

    f_base->destroy();

    return 0;
}